

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_simple_delete(planck_unit_test_t *tc)

{
  int iVar1;
  char *state;
  planck_unit_result_t pVar2;
  ion_err_t iVar3;
  ion_status_t iVar4;
  char local_a6 [8];
  char str_1 [10];
  char local_6a [8];
  ion_byte_t str [10];
  ion_value_t value;
  ion_status_t status;
  int j;
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  map.entry = &tc->result;
  initialize_hash_map_std_conditions((ion_hashmap_t *)&j);
  str._2_8_ = malloc(10);
  status.count = 0;
  while( true ) {
    if ((int)map.super.id <= status.count) {
      status.count = 0;
      iVar4 = oah_get((ion_hashmap_t *)&j,&status.count,(ion_value_t)str._2_8_);
      value._0_1_ = iVar4.error;
      pVar2 = planck_unit_assert_true
                        ((planck_unit_test_t *)map.entry,(uint)((char)value == '\0'),0x193,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      value._4_4_ = iVar4.count;
      pVar2 = planck_unit_assert_true
                        ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 1),0x194,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      status.error = '\0';
      status._1_3_ = 0;
      while( true ) {
        if ((int)map.super.id <= (int)status._0_4_) {
          if (str._2_8_ != 0) {
            free((void *)str._2_8_);
          }
          state = map.entry;
          iVar3 = oah_destroy((ion_hashmap_t *)&j);
          pVar2 = planck_unit_assert_true
                            ((planck_unit_test_t *)state,(uint)(iVar3 == '\0'),0x1bd,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            return;
          }
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iVar4 = oah_delete((ion_hashmap_t *)&j,&status);
        value._0_1_ = iVar4.error;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)((char)value == '\0'),0x199,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        value._4_4_ = iVar4.count;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 1),0x19a,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') break;
        iVar4 = oah_get((ion_hashmap_t *)&j,&status,(ion_value_t)str._2_8_);
        value._0_1_ = iVar4.error;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)((char)value == '\x01'),0x19e,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        value._4_4_ = iVar4.count;
        pVar2 = planck_unit_assert_true
                          ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 0),0x19f,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        iVar1 = status._0_4_;
        if (pVar2 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        while (status.count = iVar1 + 1, status.count < (int)map.super.id) {
          iVar4 = oah_get((ion_hashmap_t *)&j,&status.count,(ion_value_t)str._2_8_);
          value._0_1_ = iVar4.error;
          str_1._2_8_ = iVar4;
          pVar2 = planck_unit_assert_true
                            ((planck_unit_test_t *)map.entry,(uint)((char)value == '\0'),0x1a9,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') {
            longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
          }
          value._4_4_ = iVar4.count;
          pVar2 = planck_unit_assert_true
                            ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 1),0x1aa,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') {
            longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
          }
          sprintf(local_a6,"%02i is key",(ulong)(uint)status.count);
          pVar2 = planck_unit_assert_str_are_equal
                            ((planck_unit_test_t *)map.entry,(char *)str._2_8_,local_a6,0x1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                            );
          iVar1 = status.count;
          if (pVar2 == '\0') {
            longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
          }
        }
        status._0_4_ = status._0_4_ + 1;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    sprintf(local_6a,"%02i is key",(ulong)(uint)status.count);
    iVar4 = oah_insert((ion_hashmap_t *)&j,&status.count,local_6a);
    value._0_1_ = iVar4.error;
    pVar2 = planck_unit_assert_true
                      ((planck_unit_test_t *)map.entry,(uint)((char)value == '\0'),0x189,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    value._4_4_ = iVar4.count;
    pVar2 = planck_unit_assert_true
                      ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 1),0x18a,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') break;
    iVar4 = oah_get((ion_hashmap_t *)&j,&status.count,(ion_value_t)str._2_8_);
    value._0_1_ = iVar4.error;
    pVar2 = planck_unit_assert_true
                      ((planck_unit_test_t *)map.entry,(uint)((char)value == '\0'),0x18d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    value._4_4_ = iVar4.count;
    pVar2 = planck_unit_assert_true
                      ((planck_unit_test_t *)map.entry,(uint)(value._4_4_ == 1),0x18e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    status.count = status.count + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_delete(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i, j;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	ion_value_t value;

	value = malloc(10);

	for (i = 0; i < map.map_size; i++) {
		/* build up the value */
		ion_byte_t str[10];

		sprintf((char *) str, "%02i is key", i);
		/* this is will wrap the map*/
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		status = oah_get(&map, (&i), value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	i		= 0;
	status	= oah_get(&map, (&i), value);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	for (j = 0; j < map.map_size; j++) {
		/* delete the record */
		status = oah_delete(&map, (&j));
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* check to make sure that the record has been deleted */
		status = oah_get(&map, (&j), value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

		/* and then check to make sure that the rest of the map is undisturbed */
		for (i = j + 1; i < map.map_size; i++) {
/*
			ion_value_t value;
*/
			/*value	 = malloc(10);*/

			status = oah_get(&map, &i, value);
			PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
			PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

			/* build up expected value */
			char str[10];

			sprintf(str, "%02i is key", i);
			PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

			/*if (value != NULL) {
				free(value);
			}*/
		}
	}

	/* must free value after query */
	if (value != NULL) {
		free(value);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}